

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

void fn_build_full_path(char *buf,size_t buflen,char *dir,char *fname,int literal)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  undefined8 *puVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  
  iVar3 = CVmNetFile::is_net_mode();
  if (iVar3 == 0) {
    if (literal == 0) {
      os_build_full_path(buf,buflen,dir,fname);
      return;
    }
    os_combine_paths(buf,buflen,dir,fname);
    return;
  }
  if (*fname == '/') {
    lib_strcpy(buf,buflen,fname);
  }
  else {
    sVar4 = strlen(dir);
    if (sVar4 == 0) {
      pcVar6 = "/";
    }
    else {
      pcVar6 = "/";
      if (dir[sVar4 - 1] == '/') {
        pcVar6 = "";
      }
    }
    t3sprintf(buf,buflen,"%s%s%s",dir,pcVar6,fname);
  }
  if (literal != 0) {
    return;
  }
  cVar1 = *buf;
  sVar4 = strlen(buf);
  uVar8 = 0;
  puVar5 = (undefined8 *)operator_new__(-(ulong)(sVar4 >> 0x3d != 0) | sVar4 * 8);
  pcVar6 = strtok(buf,"/");
  *puVar5 = pcVar6;
  while (pcVar6 != (char *)0x0) {
    pcVar6 = strtok((char *)0x0,"/");
    puVar5[uVar8 + 1] = pcVar6;
    uVar8 = uVar8 + 1;
  }
  uVar7 = 0;
  uVar9 = 0;
  do {
    if ((uVar8 & 0xffffffff) == uVar7) {
      pcVar6 = buf;
      if (cVar1 == '/') {
        pcVar6 = buf + 1;
        *buf = '/';
      }
      uVar7 = 0;
      uVar8 = 0;
      if (0 < (int)uVar9) {
        uVar8 = (ulong)uVar9;
      }
      for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        pcVar2 = (char *)puVar5[uVar7];
        sVar4 = strlen(pcVar2);
        memcpy(pcVar6,pcVar2,sVar4);
        pcVar6 = pcVar6 + sVar4;
        if ((int)uVar7 + 1 < (int)uVar9) {
          *pcVar6 = '/';
          pcVar6 = pcVar6 + 1;
        }
      }
      *pcVar6 = '\0';
      if (*buf == '\0') {
        buf[0] = '.';
        buf[1] = '\0';
      }
      operator_delete__(puVar5);
      return;
    }
    pcVar6 = (char *)puVar5[uVar7];
    if (*pcVar6 != '\0') {
      lVar10 = (long)(int)uVar9;
      if (*pcVar6 == '.') {
        if (pcVar6[1] != '\0') {
          if ((((pcVar6[1] != '.') || (pcVar6[2] != '\0')) || ((int)uVar9 < 1)) ||
             (((pcVar2 = (char *)puVar5[(ulong)uVar9 - 1], *pcVar2 == '.' && (pcVar2[1] == '.')) &&
              (pcVar2[2] == '\0')))) goto LAB_002477ea;
          uVar9 = uVar9 - 1;
        }
      }
      else {
LAB_002477ea:
        uVar9 = uVar9 + 1;
        puVar5[lVar10] = pcVar6;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static void fn_build_full_path(
    VMG_ char *buf, size_t buflen,
    const char *dir, const char *fname, int literal)
{
    if (CVmNetFile::is_net_mode(vmg0_))
    {
        /* 
         *   Network storage mode - use Unix rules.  First, if the filename
         *   is in absolute format already, use it unchanged.  If not, append
         *   the filename to the directory, adding a '/' between the two if
         *   the directory doesn't already end with a slash.
         */
        if (fname[0] == '/')
        {
            /* the file is absolute - return it unchanged */
            lib_strcpy(buf, buflen, fname);
        }
        else
        {
            /* note the last character of the directory path */
            size_t dirlen = strlen(dir);
            char dirlast = dirlen != 0 ? dir[dirlen-1] : 0;

            /* build the result */
            t3sprintf(buf, buflen, "%s%s%s",
                      dir, dirlast == '/' ? "" : "/", fname);
        }

        /* if not in literal mode, canonicalize the result */
        if (!literal)
            nf_canonicalize(buf);
    }
    else
    {
        /* local storage mode - use local OS rules */
        if (literal)
            os_combine_paths(buf, buflen, dir, fname);
        else
            os_build_full_path(buf, buflen, dir, fname);
    }
}